

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

void densePOTRS(realtype **a,sunindextype m,realtype *b)

{
  realtype *prVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  realtype *prVar6;
  sunindextype sVar7;
  long lVar8;
  double dVar9;
  
  lVar2 = m + -1;
  lVar3 = 0;
  lVar4 = 0;
  if (0 < lVar2) {
    lVar4 = lVar2;
  }
  lVar5 = 0;
  prVar6 = b;
  sVar7 = m;
  while (lVar5 != lVar4) {
    prVar1 = a[lVar5];
    b[lVar5] = b[lVar5] / prVar1[lVar5];
    for (lVar8 = 1; sVar7 != lVar8; lVar8 = lVar8 + 1) {
      prVar6[lVar8] = prVar6[lVar8] - b[lVar5] * *(double *)((long)prVar1 + lVar8 * 8 + lVar3);
    }
    sVar7 = sVar7 + -1;
    lVar3 = lVar3 + 8;
    prVar6 = prVar6 + 1;
    lVar5 = lVar5 + 1;
  }
  prVar6 = a[m + -1];
  dVar9 = b[m + -1] / prVar6[m + -1];
  b[m + -1] = dVar9;
  b[m + -1] = dVar9 / prVar6[m + -1];
  for (lVar4 = m + -2; -1 < lVar4; lVar4 = lVar4 + -1) {
    prVar6 = a[lVar4];
    for (lVar3 = lVar2; lVar3 < m; lVar3 = lVar3 + 1) {
      b[lVar4] = b[lVar4] - prVar6[lVar3] * b[lVar3];
    }
    b[lVar4] = b[lVar4] / prVar6[lVar4];
    lVar2 = lVar2 + -1;
  }
  return;
}

Assistant:

void densePOTRS(realtype **a, sunindextype m, realtype *b)
{
  realtype *col_j, *col_i;
  sunindextype i, j;

  /* Solve C y = b, forward substitution - column version.
     Store solution y in b */
  for (j=0; j < m-1; j++) {
    col_j = a[j];
    b[j] /= col_j[j];
    for (i=j+1; i < m; i++)
      b[i] -= b[j]*col_j[i];
  }
  col_j = a[m-1];
  b[m-1] /= col_j[m-1];

  /* Solve C^T x = y, backward substitution - row version.
     Store solution x in b */
  col_j = a[m-1];
  b[m-1] /= col_j[m-1];
  for (i=m-2; i>=0; i--) {
    col_i = a[i];
    for (j=i+1; j<m; j++) 
      b[i] -= col_i[j]*b[j];
    b[i] /= col_i[i];
  }

}